

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O2

void __thiscall Fir1::Fir1(Fir1 *this,char *coeffFile,uint number_of_taps)

{
  int iVar1;
  FILE *__stream;
  invalid_argument *this_00;
  uint i;
  uint uVar2;
  vector<double,_std::allocator<double>_> tmpCoefficients;
  double v;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  this->offset = 0;
  this->mu = 0.0;
  tmpCoefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmpCoefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tmpCoefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __stream = fopen(coeffFile,"rt");
  if (__stream == (FILE *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Could not open file.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  for (uVar2 = 0; uVar2 <= number_of_taps - 1; uVar2 = uVar2 + 1) {
    v = 0.0;
    iVar1 = __isoc99_fscanf(__stream,"%lf\n",&v);
    if (iVar1 < 1) break;
    std::vector<double,_std::allocator<double>_>::push_back(&tmpCoefficients,&v);
  }
  fclose(__stream);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,&tmpCoefficients);
  initWithVector(this,(vector<double,_std::allocator<double>_> *)&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tmpCoefficients.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

Fir1::Fir1(const char* coeffFile, unsigned number_of_taps) {

	std::vector<double> tmpCoefficients;

	FILE* f=fopen(coeffFile,"rt");
	if (!f) {
		throw std::invalid_argument("Could not open file.");
	}
	for(unsigned int i=0;(i<number_of_taps)||(number_of_taps==0);i++) {
		double v = 0;
		int r = fscanf(f,"%lf\n",&v);
		if (r < 1) break;
		tmpCoefficients.push_back(v);
	}
	fclose(f);
	initWithVector(tmpCoefficients);
}